

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  pointer *pppsVar1;
  bool bVar2;
  iterator __position;
  uchar uVar3;
  section *psVar4;
  undefined **ppuVar5;
  uint uVar6;
  section *psVar7;
  section *new_section;
  section *local_18;
  
  uVar3 = get_class(this);
  if (uVar3 == '\x01') {
    psVar4 = (section *)operator_new(0x68);
    bVar2 = (this->convertor).need_conversion;
    ppuVar5 = &PTR__section_impl_001276d0;
    psVar4->_vptr_section = (_func_int **)&PTR__section_impl_001276d0;
    psVar4[7]._vptr_section = (_func_int **)(psVar4 + 9);
    psVar4[8]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)&psVar4[9]._vptr_section = 0;
    *(bool *)((long)&psVar4[0xc]._vptr_section + 4) = bVar2;
    psVar4[5]._vptr_section = (_func_int **)0x0;
    psVar4[3]._vptr_section = (_func_int **)0x0;
    psVar4[4]._vptr_section = (_func_int **)0x0;
    psVar4[1]._vptr_section = (_func_int **)0x0;
    psVar4[2]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)((long)&psVar4[0xc]._vptr_section + 5) = 0;
    psVar4[0xb]._vptr_section = (_func_int **)0x0;
    psVar7 = psVar4 + 0xc;
  }
  else {
    if (uVar3 != '\x02') {
      return (section *)0x0;
    }
    psVar4 = (section *)operator_new(0x80);
    bVar2 = (this->convertor).need_conversion;
    ppuVar5 = &PTR__section_impl_00127588;
    psVar4->_vptr_section = (_func_int **)&PTR__section_impl_00127588;
    psVar4[10]._vptr_section = (_func_int **)(psVar4 + 0xc);
    psVar4[0xb]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)&psVar4[0xc]._vptr_section = 0;
    *(bool *)((long)&psVar4[0xf]._vptr_section + 4) = bVar2;
    psVar4[7]._vptr_section = (_func_int **)0x0;
    psVar4[8]._vptr_section = (_func_int **)0x0;
    psVar4[5]._vptr_section = (_func_int **)0x0;
    psVar4[6]._vptr_section = (_func_int **)0x0;
    psVar4[3]._vptr_section = (_func_int **)0x0;
    psVar4[4]._vptr_section = (_func_int **)0x0;
    psVar4[1]._vptr_section = (_func_int **)0x0;
    psVar4[2]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)((long)&psVar4[0xf]._vptr_section + 5) = 0;
    psVar4[0xe]._vptr_section = (_func_int **)0x0;
    psVar7 = psVar4 + 0xf;
  }
  *(undefined4 *)&psVar7->_vptr_section = 0;
  uVar6 = (uint)(*(int *)&(this->sections_).
                          super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->sections_).
                         super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_18 = psVar4;
  (*(code *)ppuVar5[0x1e])(psVar4,(short)uVar6,0,uVar6);
  __position._M_current =
       (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ELFIO::section*,std::allocator<ELFIO::section*>>::
    _M_realloc_insert<ELFIO::section*const&>
              ((vector<ELFIO::section*,std::allocator<ELFIO::section*>> *)&this->sections_,
               __position,&local_18);
  }
  else {
    *__position._M_current = psVar4;
    pppsVar1 = &(this->sections_).
                super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppsVar1 = *pppsVar1 + 1;
    local_18 = psVar4;
  }
  return local_18;
}

Assistant:

section* create_section()
    {
        section*      new_section;
        unsigned char file_class = get_class();

        if ( file_class == ELFCLASS64 ) {
            new_section = new section_impl<Elf64_Shdr>( convertor );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_section = new section_impl<Elf32_Shdr>( convertor );
        }
        else {
            return 0;
        }

        new_section->set_index( (Elf_Half)sections_.size() );
        sections_.push_back( new_section );

        return new_section;
    }